

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

void __thiscall Refal2::CScanner::normalizeLineFeed(CScanner *this,char c)

{
  uint uVar1;
  
  if (c == '\r') {
LAB_00130b80:
    preprocessing(this,'\n');
    this->line = this->line + 1;
    this->position = 1;
  }
  else {
    uVar1 = (uint)c;
    if (uVar1 != 0x7f) {
      if (uVar1 == 10) {
        if (this->afterCarriageReturn != false) goto LAB_00130c1c;
        goto LAB_00130b80;
      }
      if ((0x1f < (byte)c) || ((uVar1 < 0xe && ((0x2600U >> (uVar1 & 0x1f) & 1) != 0)))) {
        preprocessing(this,c);
        uVar1 = this->position;
        this->position = uVar1 + 1;
        if ((uVar1 & 7) != 0 && c == '\t') {
          this->position = (uVar1 - (uVar1 | 0xfffffff8)) + 1;
        }
        goto LAB_00130c1c;
      }
    }
    error(this,E_InvalidControlCharacter,c);
    this->position = this->position + 1;
  }
LAB_00130c1c:
  this->afterCarriageReturn = c == '\r';
  return;
}

Assistant:

void CScanner::normalizeLineFeed( char c )
{
	if( c == CarriageReturn ) {
		preprocessing( LineFeed );
		line++;
		position = FirstCharacterNumber;
	} else if( c == LineFeed ) {
		if( !afterCarriageReturn ) {
			preprocessing( LineFeed );
			line++;
			position = FirstCharacterNumber;
		}
	} else if( IsControl( c ) ) {
		error( E_InvalidControlCharacter, c );
		position++;
	} else {
		preprocessing( c );
		position++;
		if( c == HorizontalTabulation ) {
			while( ( position - FirstCharacterNumber )
				% HorizontalTabulationSize != 0 )
			{
				position++;
			}
		}
	}
	afterCarriageReturn = ( c == CarriageReturn );
}